

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

DockPosition __thiscall QToolBarAreaLayout::findToolBar(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  QToolBarAreaLayoutLine *pQVar1;
  QToolBar *pQVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  lVar3 = 0;
  do {
    uVar4 = this->docks[lVar3].lines.d.size;
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pQVar1 = this->docks[lVar3].lines.d.ptr;
        if (pQVar1[uVar5].toolBarItems.d.size != 0) {
          lVar6 = 0;
          uVar4 = 0;
          do {
            pQVar2 = (QToolBar *)
                     (**(code **)(**(long **)((long)&(pQVar1[uVar5].toolBarItems.d.ptr)->widgetItem
                                             + lVar6) + 0x68))();
            if (pQVar2 == toolBar) {
              return (DockPosition)lVar3;
            }
            uVar4 = uVar4 + 1;
            lVar6 = lVar6 + 0x18;
          } while (uVar4 < (ulong)pQVar1[uVar5].toolBarItems.d.size);
          uVar4 = this->docks[lVar3].lines.d.size;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return DockCount;
}

Assistant:

QInternal::DockPosition QToolBarAreaLayout::findToolBar(const QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return static_cast<QInternal::DockPosition>(i);
            }
        }
    }

    return QInternal::DockCount;
}